

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htable.c
# Opt level: O1

_Bool htable_add(htable *ht,size_t hash,void *p)

{
  uintptr_t *puVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uintptr_t *puVar5;
  size_t sVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  size_t start;
  void *pvVar13;
  long lVar14;
  
  if (ht->max < ht->elems + 1) {
    uVar10 = ht->bits;
    puVar1 = ht->table;
    uVar4 = uVar10 + 1;
    bVar8 = (byte)uVar4;
    puVar5 = (uintptr_t *)calloc((long)(1 << (bVar8 & 0x1f)),8);
    ht->table = puVar5;
    if (puVar5 == (uintptr_t *)0x0) {
      ht->table = puVar1;
    }
    else {
      ht->bits = uVar4;
      ht->max = (ulong)(3L << (bVar8 & 0x3f)) >> 2;
      ht->max_with_deleted = (ulong)(9L << (bVar8 & 0x3f)) / 10;
      if ((ht->perfect_bit == 0) && (ht->common_mask != 0)) {
        uVar12 = 0;
        do {
          if ((ht->common_mask >> (uVar12 & 0x3f) & 1) != 0) {
            ht->perfect_bit = 1L << ((byte)uVar12 & 0x3f);
            break;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != 0x40);
      }
      if (puVar1 != &ht->perfect_bit) {
        uVar12 = 0;
        uVar7 = 1;
        do {
          if (1 < puVar1[uVar12]) {
            pvVar13 = (void *)(puVar1[uVar12] & ~ht->common_mask | ht->common_bits);
            sVar6 = (*ht->rehash)(pvVar13,ht->priv);
            ht_add(ht,pvVar13,sVar6);
          }
          uVar9 = uVar7 >> ((byte)uVar10 & 0x3f);
          uVar12 = uVar7;
          uVar7 = (ulong)((int)uVar7 + 1);
        } while (uVar9 == 0);
        free(puVar1);
      }
      ht->deleted = 0;
    }
    if (puVar5 == (uintptr_t *)0x0) {
      return false;
    }
  }
  if (ht->max_with_deleted < ht->elems + ht->deleted + 1) {
    lVar14 = 0;
    do {
      puVar1 = ht->table + lVar14;
      lVar14 = lVar14 + 1;
    } while (*puVar1 != 0);
    uVar4 = ht->bits;
    uVar12 = 1;
    do {
      uVar4 = ~(-1 << ((byte)uVar4 & 0x1f)) & ((int)lVar14 + (int)uVar12) - 2U;
      puVar1 = ht->table;
      uVar7 = puVar1[uVar4];
      if (uVar7 != 0) {
        if (uVar7 == 1) {
          puVar1[uVar4] = 0;
        }
        else if ((ht->perfect_bit & uVar7) == 0) {
          pvVar13 = (void *)(uVar7 & ~ht->common_mask | ht->common_bits);
          puVar1[uVar4] = 0;
          sVar6 = (*ht->rehash)(pvVar13,ht->priv);
          ht_add(ht,pvVar13,sVar6);
        }
      }
      uVar4 = ht->bits;
      uVar7 = uVar12 >> ((byte)uVar4 & 0x3f);
      uVar12 = uVar12 + 1;
    } while (uVar7 == 0);
    ht->deleted = 0;
  }
  if (p == (void *)0x0) {
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_c_cmakelists/stricaud[P]faup/src/lib/hash/htable.c"
                  ,0x109,"_Bool htable_add(struct htable *, size_t, const void *)");
  }
  uVar7 = ht->common_mask & (ulong)p;
  uVar12 = ht->common_bits;
  if (uVar7 != uVar12) {
    if (ht->elems == 0) {
      uVar12 = 0x3f;
      do {
        if (((ulong)p >> (uVar12 & 0x3f) & 1) != 0) goto LAB_001150ab;
        uVar4 = (int)uVar12 - 1;
        uVar12 = (ulong)uVar4;
      } while (uVar4 != 0);
      uVar12 = 0;
LAB_001150ab:
      bVar8 = (byte)uVar12 & 0x3f;
      ht->common_mask = -2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8;
      ht->common_bits = (ulong)p & ~(1L << (uVar12 & 0x3f));
      ht->perfect_bit = 1;
    }
    else {
      uVar7 = uVar7 ^ uVar12;
      uVar4 = ht->bits;
      puVar1 = ht->table;
      uVar9 = ~uVar7;
      uVar10 = 1;
      uVar11 = 0;
      do {
        uVar2 = puVar1[uVar11];
        if (1 < uVar2) {
          puVar1[uVar11] = uVar2 & uVar9 | uVar12 & uVar7;
        }
        uVar11 = (ulong)uVar10;
        uVar3 = uVar10 >> ((byte)uVar4 & 0x3f);
        uVar10 = uVar10 + 1;
      } while (uVar3 == 0);
      ht->common_mask = ht->common_mask & uVar9;
      ht->common_bits = ht->common_bits & uVar9;
      ht->perfect_bit = ht->perfect_bit & uVar9;
    }
  }
  ht_add(ht,p,hash);
  ht->elems = ht->elems + 1;
  return true;
}

Assistant:

bool htable_add(struct htable *ht, size_t hash, const void *p)
{
	if (ht->elems+1 > ht->max && !double_table(ht))
		return false;
	if (ht->elems+1 + ht->deleted > ht->max_with_deleted)
		rehash_table(ht);
	assert(p);
	if (((uintptr_t)p & ht->common_mask) != ht->common_bits)
		update_common(ht, p);

	ht_add(ht, p, hash);
	ht->elems++;
	return true;
}